

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_NumberIsInteger(JSContext *ctx,JSValue val)

{
  JSValue v;
  JSValue val_00;
  int iVar1;
  JSContext *in_RDX;
  JSValueUnion in_RSI;
  double dVar2;
  int64_t unaff_retaddr;
  double d;
  undefined1 local_29;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar3;
  
  v.tag = (int64_t)in_RDX;
  v.u.ptr = in_RSI.ptr;
  iVar1 = JS_IsNumber(v);
  if (iVar1 == 0) {
    uVar3 = 0;
  }
  else {
    val_00.u._4_4_ = in_stack_fffffffffffffffc;
    val_00.u.int32 = in_stack_fffffffffffffff8;
    val_00.tag = unaff_retaddr;
    iVar1 = JS_ToFloat64(in_RDX,(double *)in_RSI.ptr,val_00);
    if (iVar1 == 0) {
      local_29 = false;
      if ((ulong)ABS(local_28) < 0x7ff0000000000000) {
        dVar2 = floor(local_28);
        local_29 = dVar2 == local_28;
      }
      uVar3 = (uint)local_29;
    }
    else {
      uVar3 = 0xffffffff;
    }
  }
  return uVar3;
}

Assistant:

static int JS_NumberIsInteger(JSContext *ctx, JSValueConst val)
{
    double d;
    if (!JS_IsNumber(val))
        return FALSE;
    if (unlikely(JS_ToFloat64(ctx, &d, val)))
        return -1;
    return isfinite(d) && floor(d) == d;
}